

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  short sVar1;
  stbi__uint32 sVar2;
  undefined8 uVar3;
  byte bVar4;
  short sVar5;
  bool bVar6;
  _func_void_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *p_Var7;
  stbi_uc sVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  void *pvVar21;
  code *pcVar22;
  uchar *puVar23;
  undefined8 *puVar24;
  stbi__context *psVar25;
  stbi_uc *psVar26;
  float *data_00;
  stbi_uc *psVar27;
  stbi_uc *psVar28;
  undefined1 uVar29;
  short sVar30;
  stbi__uint32 sVar31;
  stbi_uc *psVar32;
  long lVar33;
  undefined8 *puVar34;
  uchar uVar35;
  byte bVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  short *data_01;
  stbi__context *psVar40;
  ulong uVar41;
  uint uVar42;
  long lVar43;
  int *piVar44;
  uchar *__ptr;
  stbi__uint32 y_00;
  long lVar45;
  long lVar46;
  uchar *puVar47;
  ulong uVar48;
  ulong uVar49;
  stbi__uint32 z;
  code *pcVar50;
  stbi__context **ppsVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  uint uVar55;
  undefined1 auVar56 [8];
  bool bVar57;
  undefined1 local_4a38 [8];
  stbi__jpeg j;
  short local_1d8 [4];
  short data [64];
  stbi__context *local_118;
  stbi_uc *coutput [4];
  uint local_cc;
  uint local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  int local_9c;
  int local_7c;
  uint local_50;
  uint local_44;
  uint local_38;
  
  j._18272_8_ = stbi__idct_block;
  pcVar50 = stbi__YCbCr_to_RGB_row;
  j.idct_block_kernel = stbi__YCbCr_to_RGB_row;
  j.YCbCr_to_RGB_kernel = stbi__resample_row_hv_2;
  j.code_buffer._0_1_ = 0xff;
  local_4a38 = (undefined1  [8])s;
  sVar8 = stbi__get_marker((stbi__jpeg *)local_4a38);
  if (sVar8 == 0xd8) {
    s->img_buffer = s->img_buffer_original;
    j._18272_8_ = stbi__idct_block;
    j.idct_block_kernel = stbi__YCbCr_to_RGB_row;
    j.YCbCr_to_RGB_kernel = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      j.img_comp[0].data = (stbi_uc *)0x0;
      j.img_comp[0].raw_data = (void *)0x0;
      j.img_comp[1].data = (stbi_uc *)0x0;
      j.img_comp[1].raw_data = (void *)0x0;
      j.img_comp[2].data = (stbi_uc *)0x0;
      j.img_comp[2].raw_data = (void *)0x0;
      j.img_comp[3].data = (stbi_uc *)0x0;
      j.img_comp[3].raw_data = (void *)0x0;
      j.order[2] = 0;
      local_4a38 = (undefined1  [8])s;
      iVar10 = stbi__decode_jpeg_header((stbi__jpeg *)local_4a38,0);
      if (iVar10 == 0) {
LAB_00114c11:
        stbi__cleanup_jpeg((stbi__jpeg *)local_4a38);
        return (uchar *)0x0;
      }
      bVar9 = stbi__get_marker((stbi__jpeg *)local_4a38);
LAB_00112e87:
      if (bVar9 != 0xda) {
        if (bVar9 == 0xd9) {
          uVar54 = *(int *)((long)local_4a38 + 8);
          auVar56 = local_4a38;
          if (0 < (int)uVar54 && j._18216_4_ != 0) {
            lVar43 = 0;
            do {
              pcVar50 = (code *)(lVar43 * 0x60);
              iVar10 = j.img_comp[lVar43].dc_pred + 7 >> 3;
              if (0 < iVar10) {
                pcVar50 = (code *)(((stbi__context *)((long)pcVar50 + 0x4510))->buffer_start +
                                  (long)(j.huff_dc[0].fast + 0x48));
                uVar54 = j.img_comp[lVar43].ha + 7 >> 3;
                iVar39 = 0;
                do {
                  if (0 < (int)uVar54) {
                    uVar49 = 0;
                    do {
                      iVar15 = *(int *)&j.img_comp[lVar43].coeff * iVar39 + (int)uVar49;
                      psVar26 = j.img_comp[lVar43].linebuf;
                      iVar11 = j.img_comp[lVar43].h;
                      lVar33 = 0;
                      do {
                        *(ushort *)(psVar26 + lVar33 * 2 + (long)(iVar15 * 0x40) * 2) =
                             (ushort)j.dequant[(long)iVar11 + -1][lVar33 + 0x38] *
                             *(short *)(psVar26 + lVar33 * 2 + (long)(iVar15 * 0x40) * 2);
                        lVar33 = lVar33 + 1;
                      } while (lVar33 != 0x40);
                      (*(code *)j._18272_8_)
                                ((long)(iVar39 * 8 * j.img_comp[lVar43].x) +
                                 *(long *)&j.img_comp[lVar43].h2 + uVar49 * 8);
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar54);
                  }
                  iVar39 = iVar39 + 1;
                  auVar56 = local_4a38;
                } while (iVar39 != iVar10);
              }
              lVar43 = lVar43 + 1;
              uVar54 = ((stbi__context *)auVar56)->img_n;
            } while (lVar43 < (int)uVar54);
          }
          p_Var7 = j.YCbCr_to_RGB_kernel;
          if (req_comp == 0) {
            req_comp = uVar54;
          }
          uVar52 = 1;
          if (2 < req_comp) {
            uVar52 = uVar54;
          }
          if (uVar54 != 3) {
            uVar52 = uVar54;
          }
          sVar2 = ((stbi__context *)auVar56)->img_x;
          if ((int)uVar52 < 1) {
LAB_0011486c:
            sVar31 = ((stbi__context *)auVar56)->img_y;
            puVar23 = (uchar *)malloc((ulong)(sVar2 * req_comp * sVar31 + 1));
            if (puVar23 != (uchar *)0x0) {
              if (sVar31 != 0) {
                iVar10 = 0;
                uVar54 = 0;
                do {
                  sVar2 = ((stbi__context *)auVar56)->img_x;
                  if (0 < (int)uVar52) {
                    ppsVar51 = &local_118;
                    lVar43 = 0;
                    do {
                      puVar24 = (undefined8 *)((long)data + lVar43 + 8);
                      iVar39 = *(int *)((long)data + lVar43 + 0x1c);
                      iVar11 = *(int *)((long)data + lVar43 + 0x14);
                      iVar15 = iVar11 >> 1;
                      puVar34 = puVar24;
                      if (iVar39 < iVar15) {
                        puVar34 = (undefined8 *)((long)data + lVar43);
                      }
                      if (iVar15 <= iVar39) {
                        puVar24 = (undefined8 *)((long)data + lVar43);
                      }
                      psVar25 = (stbi__context *)
                                (**(code **)((long)local_1d8 + lVar43))
                                          (*(undefined8 *)
                                            ((long)&j.img_comp[0].raw_coeff + lVar43 * 2),*puVar34,
                                           *puVar24,*(undefined4 *)((long)data + lVar43 + 0x18),
                                           *(undefined4 *)((long)data + lVar43 + 0x10));
                      *ppsVar51 = psVar25;
                      *(int *)((long)data + lVar43 + 0x1c) = iVar39 + 1;
                      if (iVar11 <= iVar39 + 1) {
                        *(undefined4 *)((long)data + lVar43 + 0x1c) = 0;
                        lVar33 = *(long *)((long)data + lVar43 + 8);
                        *(long *)((long)data + lVar43) = lVar33;
                        iVar39 = *(int *)((long)data + lVar43 + 0x20) + 1;
                        *(int *)((long)data + lVar43 + 0x20) = iVar39;
                        if (iVar39 < *(int *)((long)&j.img_comp[0].dc_pred + lVar43 * 2)) {
                          *(long *)((long)data + lVar43 + 8) =
                               lVar33 + *(int *)((long)&j.img_comp[0].x + lVar43 * 2);
                        }
                      }
                      lVar43 = lVar43 + 0x30;
                      ppsVar51 = ppsVar51 + 1;
                      pcVar50 = (code *)local_118;
                      auVar56 = local_4a38;
                    } while ((ulong)uVar52 * 0x30 != lVar43);
                  }
                  if (req_comp < 3) {
                    if (req_comp == 1) {
                      if (((stbi__context *)auVar56)->img_x != 0) {
                        uVar49 = 0;
                        do {
                          puVar23[uVar49 + sVar2 * iVar10] =
                               ((stbi__context *)pcVar50)->buffer_start[uVar49 - 0x38];
                          uVar49 = uVar49 + 1;
                        } while (uVar49 < ((stbi__context *)auVar56)->img_x);
                      }
                    }
                    else if (((stbi__context *)auVar56)->img_x != 0) {
                      uVar49 = 0;
                      do {
                        puVar23[uVar49 * 2 + (ulong)(sVar2 * iVar10)] =
                             ((stbi__context *)pcVar50)->buffer_start[uVar49 - 0x38];
                        puVar23[uVar49 * 2 + (ulong)(sVar2 * iVar10) + 1] = 0xff;
                        uVar49 = uVar49 + 1;
                      } while (uVar49 < ((stbi__context *)auVar56)->img_x);
                    }
                  }
                  else if (((stbi__context *)auVar56)->img_n == 3) {
                    (*j.idct_block_kernel)
                              (puVar23 + uVar54 * req_comp * sVar2,(int)pcVar50,(short *)coutput[0])
                    ;
                    auVar56 = local_4a38;
                  }
                  else if (((stbi__context *)auVar56)->img_x != 0) {
                    puVar47 = puVar23 + (ulong)(sVar2 * iVar10) + 3;
                    uVar49 = 0;
                    do {
                      uVar35 = ((stbi__context *)pcVar50)->buffer_start[uVar49 - 0x38];
                      puVar47[-1] = uVar35;
                      puVar47[-2] = uVar35;
                      puVar47[-3] = uVar35;
                      *puVar47 = 0xff;
                      uVar49 = uVar49 + 1;
                      puVar47 = puVar47 + (uint)req_comp;
                    } while (uVar49 < ((stbi__context *)auVar56)->img_x);
                  }
                  uVar54 = uVar54 + 1;
                  iVar10 = iVar10 + req_comp;
                } while (uVar54 < ((stbi__context *)auVar56)->img_y);
              }
              stbi__cleanup_jpeg((stbi__jpeg *)local_4a38);
              *x = *(stbi__uint32 *)local_4a38;
              *y = *(stbi__uint32 *)((long)local_4a38 + 4);
              if (comp != (int *)0x0) {
                *comp = *(int *)((long)local_4a38 + 8);
                return puVar23;
              }
              return puVar23;
            }
          }
          else {
            pcVar50 = (code *)0x0;
            while( true ) {
              pvVar21 = malloc((ulong)(sVar2 + 3));
              *(void **)((long)&j.img_comp[0].raw_coeff + (long)pcVar50 * 2) = pvVar21;
              if (pvVar21 == (void *)0x0) break;
              uVar49 = (long)(int)j.fast_ac[3]._1016_4_ /
                       (long)*(int *)((long)j.img_comp + (long)pcVar50 * 2 + -4);
              iVar10 = (int)uVar49;
              *(int *)((long)data + (long)pcVar50 + 0x10) = iVar10;
              iVar39 = (int)j.fast_ac[3]._1020_4_ /
                       *(int *)((long)&j.img_comp[0].id + (long)pcVar50 * 2);
              *(int *)((long)data + (long)pcVar50 + 0x14) = iVar39;
              *(int *)((long)data + (long)pcVar50 + 0x1c) = iVar39 >> 1;
              *(int *)((long)data + (long)pcVar50 + 0x18) =
                   (int)((ulong)((sVar2 - 1) + iVar10) / (uVar49 & 0xffffffff));
              *(undefined4 *)((long)data + (long)pcVar50 + 0x20) = 0;
              uVar3 = *(undefined8 *)((long)&j.img_comp[0].h2 + (long)pcVar50 * 2);
              *(undefined8 *)((long)data + (long)pcVar50 + 8) = uVar3;
              *(undefined8 *)((long)data + (long)pcVar50) = uVar3;
              if (iVar10 == 2) {
                pcVar22 = stbi__resample_row_h_2;
                if ((iVar39 != 1) && (pcVar22 = p_Var7, iVar39 != 2)) goto LAB_00114850;
              }
              else if (iVar10 == 1) {
                pcVar22 = stbi__resample_row_generic;
                if (iVar39 == 2) {
                  pcVar22 = stbi__resample_row_v_2;
                }
                if (iVar39 == 1) {
                  pcVar22 = resample_row_1;
                }
              }
              else {
LAB_00114850:
                pcVar22 = stbi__resample_row_generic;
              }
              *(code **)((long)local_1d8 + (long)pcVar50) = pcVar22;
              pcVar50 = (code *)((long)pcVar50 + 0x30);
              if ((code *)((ulong)uVar52 * 0x30) == pcVar50) goto LAB_0011486c;
            }
          }
          stbi__cleanup_jpeg((stbi__jpeg *)local_4a38);
          goto LAB_00114bed;
        }
        iVar10 = stbi__process_marker((stbi__jpeg *)local_4a38,(uint)bVar9);
        if (iVar10 != 0) goto LAB_00112eae;
        goto LAB_00114c11;
      }
      iVar10 = stbi__get16be((stbi__context *)local_4a38);
      auVar56 = local_4a38;
      pbVar20 = *(stbi_uc **)((long)local_4a38 + 0xb8);
      if (pbVar20 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
        *(byte **)((long)local_4a38 + 0xb8) = pbVar20 + 1;
        bVar9 = *pbVar20;
LAB_00112f49:
        j.succ_low = (uint)bVar9;
        if (((byte)(bVar9 - 5) < 0xfc) || (*(int *)((long)local_4a38 + 8) < (int)(uint)bVar9))
        goto LAB_00114c03;
        if (iVar10 == (uint)bVar9 * 2 + 6) {
          lVar43 = 0;
          pcVar50 = (code *)local_4a38;
          do {
            piVar44 = &j.img_mcu_w;
            pbVar19 = ((stbi__context *)pcVar50)->img_buffer;
            pbVar20 = ((stbi__context *)pcVar50)->img_buffer_end;
            if (pbVar19 < pbVar20) {
              ((stbi__context *)pcVar50)->img_buffer = pbVar19 + 1;
              uVar54 = (uint)*pbVar19;
              pbVar19 = pbVar19 + 1;
            }
            else if (((stbi__context *)pcVar50)->read_from_callbacks == 0) {
              uVar54 = 0;
            }
            else {
              psVar26 = ((stbi__context *)pcVar50)->buffer_start;
              iVar10 = (*(((stbi__context *)pcVar50)->io).read)
                                 (((stbi__context *)pcVar50)->io_user_data,(char *)psVar26,
                                  ((stbi__context *)pcVar50)->buflen);
              if (iVar10 == 0) {
                ((stbi__context *)pcVar50)->read_from_callbacks = 0;
                psVar32 = ((stbi__context *)pcVar50)->buffer_start + 1;
                ((stbi__context *)pcVar50)->buffer_start[0] = '\0';
                uVar54 = 0;
              }
              else {
                psVar32 = psVar26 + iVar10;
                uVar54 = (uint)*psVar26;
              }
              ((stbi__context *)pcVar50)->img_buffer_end = psVar32;
              ((stbi__context *)pcVar50)->img_buffer = ((stbi__context *)pcVar50)->buffer_start + 1;
              pbVar19 = *(stbi_uc **)((long)local_4a38 + 0xb8);
              pbVar20 = *(stbi_uc **)((long)local_4a38 + 0xc0);
              pcVar50 = (code *)local_4a38;
            }
            if (pbVar19 < pbVar20) {
              ((stbi__context *)pcVar50)->img_buffer = pbVar19 + 1;
              bVar9 = *pbVar19;
            }
            else if (((stbi__context *)pcVar50)->read_from_callbacks == 0) {
              bVar9 = 0;
            }
            else {
              psVar26 = ((stbi__context *)pcVar50)->buffer_start;
              iVar10 = (*(((stbi__context *)pcVar50)->io).read)
                                 (((stbi__context *)pcVar50)->io_user_data,(char *)psVar26,
                                  ((stbi__context *)pcVar50)->buflen);
              if (iVar10 == 0) {
                ((stbi__context *)pcVar50)->read_from_callbacks = 0;
                psVar32 = ((stbi__context *)pcVar50)->buffer_start + 1;
                ((stbi__context *)pcVar50)->buffer_start[0] = '\0';
                bVar9 = 0;
              }
              else {
                psVar32 = psVar26 + iVar10;
                bVar9 = *psVar26;
              }
              ((stbi__context *)pcVar50)->img_buffer_end = psVar32;
              ((stbi__context *)pcVar50)->img_buffer = ((stbi__context *)pcVar50)->buffer_start + 1;
              pcVar50 = (code *)local_4a38;
            }
            iVar10 = ((stbi__context *)pcVar50)->img_n;
            if ((long)iVar10 < 1) {
              uVar49 = 0;
            }
            else {
              uVar49 = 0;
              while (*piVar44 != uVar54) {
                uVar49 = uVar49 + 1;
                piVar44 = piVar44 + 0x18;
                if ((long)iVar10 == uVar49) goto LAB_00114c11;
              }
            }
            if ((int)uVar49 == iVar10) goto LAB_00114c11;
            j.img_comp[uVar49 & 0xffffffff].v = (uint)(bVar9 >> 4);
            if (0x3f < bVar9) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_00114c11;
            }
            j.img_comp[uVar49 & 0xffffffff].tq = bVar9 & 0xf;
            if (3 < (bVar9 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_00114c11;
            }
            j.order[lVar43 + -2] = (int)uVar49;
            lVar43 = lVar43 + 1;
          } while (lVar43 < j.succ_low);
          pbVar20 = ((stbi__context *)pcVar50)->img_buffer;
          pbVar19 = ((stbi__context *)pcVar50)->img_buffer_end;
          if (pbVar20 < pbVar19) {
            ((stbi__context *)pcVar50)->img_buffer = pbVar20 + 1;
            bVar9 = *pbVar20;
            pbVar20 = pbVar20 + 1;
          }
          else if (((stbi__context *)pcVar50)->read_from_callbacks == 0) {
            bVar9 = 0;
          }
          else {
            psVar26 = ((stbi__context *)pcVar50)->buffer_start;
            iVar10 = (*(((stbi__context *)pcVar50)->io).read)
                               (((stbi__context *)pcVar50)->io_user_data,(char *)psVar26,
                                ((stbi__context *)pcVar50)->buflen);
            if (iVar10 == 0) {
              ((stbi__context *)pcVar50)->read_from_callbacks = 0;
              psVar32 = ((stbi__context *)pcVar50)->buffer_start + 1;
              ((stbi__context *)pcVar50)->buffer_start[0] = '\0';
              bVar9 = 0;
            }
            else {
              psVar32 = psVar26 + iVar10;
              bVar9 = *psVar26;
            }
            ((stbi__context *)pcVar50)->img_buffer_end = psVar32;
            ((stbi__context *)pcVar50)->img_buffer = ((stbi__context *)pcVar50)->buffer_start + 1;
            pbVar20 = *(stbi_uc **)((long)local_4a38 + 0xb8);
            pbVar19 = *(stbi_uc **)((long)local_4a38 + 0xc0);
            pcVar50 = (code *)local_4a38;
          }
          j.nomore = (uint)bVar9;
          if (pbVar20 < pbVar19) {
            ((stbi__context *)pcVar50)->img_buffer = pbVar20 + 1;
            j.progressive = (int)*pbVar20;
            pbVar20 = pbVar20 + 1;
          }
          else if (((stbi__context *)pcVar50)->read_from_callbacks == 0) {
            j.progressive = 0;
          }
          else {
            psVar26 = ((stbi__context *)pcVar50)->buffer_start;
            iVar10 = (*(((stbi__context *)pcVar50)->io).read)
                               (((stbi__context *)pcVar50)->io_user_data,(char *)psVar26,
                                ((stbi__context *)pcVar50)->buflen);
            if (iVar10 == 0) {
              ((stbi__context *)pcVar50)->read_from_callbacks = 0;
              psVar32 = ((stbi__context *)pcVar50)->buffer_start + 1;
              ((stbi__context *)pcVar50)->buffer_start[0] = '\0';
              j.progressive = 0;
            }
            else {
              psVar32 = psVar26 + iVar10;
              j.progressive = (int)*psVar26;
            }
            ((stbi__context *)pcVar50)->img_buffer_end = psVar32;
            ((stbi__context *)pcVar50)->img_buffer = ((stbi__context *)pcVar50)->buffer_start + 1;
            pbVar20 = *(stbi_uc **)((long)local_4a38 + 0xb8);
            pbVar19 = *(stbi_uc **)((long)local_4a38 + 0xc0);
            pcVar50 = (code *)local_4a38;
          }
          if (pbVar20 < pbVar19) {
            ((stbi__context *)pcVar50)->img_buffer = pbVar20 + 1;
            bVar9 = *pbVar20;
          }
          else if (((stbi__context *)pcVar50)->read_from_callbacks == 0) {
            bVar9 = 0;
          }
          else {
            psVar26 = ((stbi__context *)pcVar50)->buffer_start;
            iVar10 = (*(((stbi__context *)pcVar50)->io).read)
                               (((stbi__context *)pcVar50)->io_user_data,(char *)psVar26,
                                ((stbi__context *)pcVar50)->buflen);
            if (iVar10 == 0) {
              ((stbi__context *)pcVar50)->read_from_callbacks = 0;
              psVar32 = ((stbi__context *)pcVar50)->buffer_start + 1;
              ((stbi__context *)pcVar50)->buffer_start[0] = '\0';
              bVar9 = 0;
            }
            else {
              psVar32 = psVar26 + iVar10;
              bVar9 = *psVar26;
            }
            ((stbi__context *)pcVar50)->img_buffer_end = psVar32;
            ((stbi__context *)pcVar50)->img_buffer = ((stbi__context *)pcVar50)->buffer_start + 1;
          }
          iVar10 = j.eob_run;
          j.spec_start = (uint)(bVar9 >> 4);
          j.spec_end = bVar9 & 0xf;
          if (j._18216_4_ == 0) {
            if ((j.nomore != 0) || ((0xf < bVar9 || ((bVar9 & 0xf) != 0)))) {
LAB_00114e33:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_00114c11;
            }
            j.progressive = 0x3f;
          }
          else if ((((0x3f < j.nomore) || (0x3f < j.progressive)) || (j.progressive < j.nomore)) ||
                  ((0xdf < bVar9 || (0xd < (bVar9 & 0xf))))) goto LAB_00114e33;
          iVar39 = j.order[2];
          if (j.order[2] == 0) {
            iVar39 = 0x7fffffff;
          }
          j.img_comp[3].coeff_w = 0;
          j.img_comp[3].coeff_h = 0;
          j.code_bits = 0;
          j.img_comp[2].hd = 0;
          j.img_comp[1].hd = 0;
          j.img_comp[0].hd = 0;
          j.code_buffer._0_1_ = 0xff;
          j.order[3] = iVar39;
          j.succ_high = 0;
          if (j._18216_4_ == 0) {
            if (j.succ_low == 1) {
              lVar43 = (long)j.eob_run;
              pcVar50 = (code *)(lVar43 * 0x60);
              iVar39 = j.img_comp[lVar43].dc_pred + 7 >> 3;
              bVar57 = true;
              if (0 < iVar39) {
                pcVar50 = (code *)(((stbi__context *)((long)pcVar50 + 0x4510))->buffer_start +
                                  (long)(j.huff_dc[0].fast + 0x48));
                uVar54 = j.img_comp[lVar43].ha + 7 >> 3;
                iVar15 = 0;
                iVar11 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar33 = 0;
                    do {
                      lVar45 = (long)j.img_comp[lVar43].tq;
                      iVar37 = stbi__jpeg_decode_block
                                         ((stbi__jpeg *)local_4a38,local_1d8,
                                          (stbi__huffman *)
                                          (j.huff_dc[(long)j.img_comp[lVar43].v + -1].delta + 0xf),
                                          (stbi__huffman *)(j.huff_ac[lVar45 + -1].delta + 0xf),
                                          j.fast_ac[lVar45 + -1] + 0x1fc,iVar10,
                                          j.dequant[(long)j.img_comp[lVar43].h + -1] + 0x38);
                      if (iVar37 == 0) goto LAB_001140ac;
                      iVar37 = j.img_comp[lVar43].x;
                      (*(code *)j._18272_8_)
                                ((long)(iVar15 * iVar37) + *(long *)&j.img_comp[lVar43].h2 + lVar33,
                                 iVar37,local_1d8);
                      iVar37 = j.order[3];
                      j.order[3] = j.order[3] + -1;
                      if (iVar37 < 2) {
                        if (j.img_comp[3].coeff_h < 0x18) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                        }
                        if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_001140a5;
                        j.img_comp[3].coeff_w = 0;
                        j.img_comp[3].coeff_h = 0;
                        j.code_bits = 0;
                        j.img_comp[2].hd = 0;
                        j.img_comp[1].hd = 0;
                        j.img_comp[0].hd = 0;
                        j.code_buffer._0_1_ = 0xff;
                        j.order[3] = j.order[2];
                        if (j.order[2] == 0) {
                          j.order[3] = 0x7fffffff;
                        }
                        j.succ_high = 0;
                      }
                      lVar33 = lVar33 + 8;
                    } while ((ulong)uVar54 * 8 != lVar33);
                  }
                  iVar11 = iVar11 + 1;
                  iVar15 = iVar15 + 8;
                } while (iVar11 != iVar39);
LAB_001140a5:
                bVar57 = true;
              }
            }
            else {
              bVar57 = true;
              if (0 < j.img_v_max) {
                iVar10 = 0;
                iVar11 = j.img_v_max;
                iVar15 = j.img_h_max;
                do {
                  if (0 < iVar15) {
                    iVar37 = 0;
                    do {
                      if (0 < j.succ_low) {
                        lVar43 = 0;
                        iVar11 = j.succ_low;
                        do {
                          iVar39 = j.order[lVar43 + -2];
                          lVar33 = (long)iVar39;
                          pcVar50 = (code *)(lVar33 * 0x60);
                          iVar15 = j.img_comp[lVar33].id;
                          if (0 < iVar15) {
                            pcVar50 = (code *)(((stbi__context *)((long)pcVar50 + 0x4510))->
                                               buffer_start + (long)(j.huff_dc[0].fast + 0x48));
                            iVar12 = (&j.img_mcu_h)[lVar33 * 0x18];
                            iVar53 = 0;
                            do {
                              if (0 < iVar12) {
                                iVar11 = 0;
                                do {
                                  iVar15 = j.img_comp[lVar33].id;
                                  lVar45 = (long)j.img_comp[lVar33].tq;
                                  iVar14 = stbi__jpeg_decode_block
                                                     ((stbi__jpeg *)local_4a38,local_1d8,
                                                      (stbi__huffman *)
                                                      (j.huff_dc[(long)j.img_comp[lVar33].v + -1].
                                                       delta + 0xf),
                                                      (stbi__huffman *)
                                                      (j.huff_ac[lVar45 + -1].delta + 0xf),
                                                      j.fast_ac[lVar45 + -1] + 0x1fc,iVar39,
                                                      j.dequant[(long)j.img_comp[lVar33].h + -1] +
                                                      0x38);
                                  if (iVar14 == 0) goto LAB_001140ac;
                                  iVar14 = j.img_comp[lVar33].x;
                                  (*(code *)j._18272_8_)
                                            ((long)((iVar12 * iVar37 + iVar11) * 8) +
                                             (long)((iVar15 * iVar10 + iVar53) * iVar14 * 8) +
                                             *(long *)&j.img_comp[lVar33].h2,iVar14,local_1d8);
                                  iVar11 = iVar11 + 1;
                                  iVar12 = (&j.img_mcu_h)[lVar33 * 0x18];
                                } while (iVar11 < iVar12);
                                iVar15 = j.img_comp[lVar33].id;
                              }
                              iVar53 = iVar53 + 1;
                              iVar11 = j.succ_low;
                            } while (iVar53 < iVar15);
                          }
                          lVar43 = lVar43 + 1;
                          iVar39 = j.order[3];
                        } while (lVar43 < iVar11);
                      }
                      j.order[3] = iVar39 + -1;
                      if (iVar39 < 2) {
                        if (j.img_comp[3].coeff_h < 0x18) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                        }
                        if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_001140a5;
                        j.img_comp[3].coeff_w = 0;
                        j.img_comp[3].coeff_h = 0;
                        j.code_bits = 0;
                        j.img_comp[2].hd = 0;
                        j.img_comp[1].hd = 0;
                        j.img_comp[0].hd = 0;
                        j.code_buffer._0_1_ = 0xff;
                        j.order[3] = j.order[2];
                        if (j.order[2] == 0) {
                          j.order[3] = 0x7fffffff;
                        }
                        j.succ_high = 0;
                      }
                      iVar37 = iVar37 + 1;
                      iVar11 = j.img_v_max;
                      iVar15 = j.img_h_max;
                      iVar39 = j.order[3];
                    } while (iVar37 < j.img_h_max);
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < iVar11);
                goto LAB_001140a5;
              }
            }
            goto LAB_001140ae;
          }
          if (j.succ_low == 1) {
            lVar43 = (long)j.eob_run;
            iVar39 = j.img_comp[lVar43].dc_pred + 7 >> 3;
            if (0 < iVar39) {
              iVar11 = j.img_comp[lVar43].ha + 7 >> 3;
              local_44 = 0;
              do {
                if (0 < iVar11) {
                  iVar15 = 0;
                  do {
                    data_01 = (short *)(j.img_comp[lVar43].linebuf +
                                       (long)(int)((*(int *)&j.img_comp[lVar43].coeff * local_44 +
                                                   iVar15) * 0x40) * 2);
                    pcVar50 = (code *)(long)j.nomore;
                    if ((stbi__context *)pcVar50 == (stbi__context *)0x0) {
                      iVar37 = stbi__jpeg_decode_block_prog_dc
                                         ((stbi__jpeg *)local_4a38,data_01,
                                          (stbi__huffman *)
                                          (j.huff_dc[(long)j.img_comp[lVar43].v + -1].delta + 0xf),
                                          iVar10);
                      if (iVar37 == 0) goto LAB_00114c11;
                    }
                    else {
                      lVar33 = (long)j.img_comp[lVar43].tq;
                      bVar9 = (byte)j.spec_end;
                      if (j.spec_start == 0) {
                        iVar37 = j.img_comp[3].coeff_h;
                        if (j.succ_high == 0) {
                          do {
                            if (iVar37 < 0x10) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                            }
                            uVar49 = (ulong)((uint)j.img_comp[3].coeff_w >> 0x17);
                            sVar30 = j.fast_ac[lVar33 + -1][uVar49 + 0x1fc];
                            uVar54 = (uint)sVar30;
                            iVar12 = (int)pcVar50;
                            if (sVar30 == 0) {
                              if (j.img_comp[3].coeff_h < 0x10) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                uVar49 = (ulong)((uint)j.img_comp[3].coeff_w >> 0x17);
                              }
                              uVar49 = (ulong)j.huff_ac[lVar33].fast[uVar49 - 8];
                              if (uVar49 == 0xff) {
                                lVar45 = 0;
                                do {
                                  lVar46 = lVar45;
                                  lVar45 = lVar46 + 1;
                                } while (j.huff_ac[lVar33].maxcode[lVar46 + 8] <=
                                         (uint)j.img_comp[3].coeff_w >> 0x10);
                                if (lVar45 == 8) goto LAB_00115605;
                                if (j.img_comp[3].coeff_h < (int)(lVar46 + 10)) goto LAB_0011560e;
                                uVar49 = (ulong)(int)(((uint)j.img_comp[3].coeff_w >>
                                                       (0x17U - (char)lVar45 & 0x1f) &
                                                      stbi__bmask[lVar46 + 10]) +
                                                     j.huff_ac[lVar33].delta[lVar46 + 8]);
                                bVar36 = j.huff_ac[lVar33].size[uVar49 - 8];
                                if (((uint)j.img_comp[3].coeff_w >> (-bVar36 & 0x1f) &
                                    stbi__bmask[bVar36]) != (uint)j.huff_ac[lVar33].code[uVar49 - 4]
                                   ) goto LAB_001168d5;
                                iVar37 = (j.img_comp[3].coeff_h - (int)lVar45) + -9;
                                uVar54 = j.img_comp[3].coeff_w << ((byte)(lVar46 + 10) & 0x1f);
                                j.img_comp[3].coeff_h = iVar37;
                                j.img_comp[3].coeff_w = uVar54;
                              }
                              else {
                                bVar36 = j.huff_ac[lVar33].size[uVar49 - 8];
                                iVar37 = j.img_comp[3].coeff_h - (uint)bVar36;
                                if (j.img_comp[3].coeff_h < (int)(uint)bVar36) goto LAB_0011560e;
                                uVar54 = j.img_comp[3].coeff_w << (bVar36 & 0x1f);
                                j.img_comp[3].coeff_h = iVar37;
                                j.img_comp[3].coeff_w = uVar54;
                              }
                              bVar36 = j.huff_ac[lVar33].values[uVar49 - 8];
                              uVar52 = bVar36 & 0xf;
                              bVar4 = bVar36 >> 4;
                              uVar42 = (uint)bVar4;
                              if ((bVar36 & 0xf) == 0) {
                                if (bVar36 < 0xf0) {
                                  j.succ_high = 1 << bVar4;
                                  if (0xf < bVar36) {
                                    if (iVar37 < (int)uVar42) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                      iVar37 = j.img_comp[3].coeff_h;
                                      uVar54 = j.img_comp[3].coeff_w;
                                    }
                                    uVar54 = uVar54 << bVar4 | uVar54 >> 0x20 - bVar4;
                                    j.succ_high = j.succ_high + (uVar54 & stbi__bmask[uVar42]);
                                    j.img_comp[3].coeff_h = iVar37 - uVar42;
                                    j.img_comp[3].coeff_w = ~stbi__bmask[uVar42] & uVar54;
                                  }
                                  goto LAB_0011350b;
                                }
                                uVar52 = iVar12 + 0x10;
                              }
                              else {
                                lVar45 = (long)iVar12 + (ulong)uVar42;
                                bVar36 = ""[lVar45];
                                if (iVar37 < (int)uVar52) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                  iVar37 = j.img_comp[3].coeff_h;
                                  uVar54 = j.img_comp[3].coeff_w;
                                }
                                uVar13 = uVar54 << (sbyte)uVar52 | uVar54 >> 0x20 - (sbyte)uVar52;
                                uVar42 = *(uint *)((long)stbi__bmask + (ulong)(uVar52 * 4));
                                iVar37 = iVar37 - uVar52;
                                j.img_comp[3].coeff_h = iVar37;
                                j.img_comp[3].coeff_w = ~uVar42 & uVar13;
                                iVar12 = 0;
                                if (-1 < (int)uVar54) {
                                  iVar12 = *(int *)((long)stbi__jbias + (ulong)(uVar52 * 4));
                                }
                                uVar52 = (int)lVar45 + 1;
                                data_01[bVar36] =
                                     (short)((uVar13 & uVar42) + iVar12 << (bVar9 & 0x1f));
                              }
                            }
                            else {
                              lVar45 = (long)iVar12 + (ulong)(uVar54 >> 4 & 0xf);
                              iVar37 = j.img_comp[3].coeff_h - (uVar54 & 0xf);
                              j.img_comp[3].coeff_h = iVar37;
                              j.img_comp[3].coeff_w = j.img_comp[3].coeff_w << (sbyte)(uVar54 & 0xf)
                              ;
                              uVar52 = (int)lVar45 + 1;
                              data_01[""[lVar45]] = (short)((uVar54 >> 8) << (bVar9 & 0x1f));
                            }
                            pcVar50 = (code *)(ulong)uVar52;
                          } while ((int)uVar52 <= j.progressive);
                        }
                        else {
LAB_0011350b:
                          j.succ_high = j.succ_high + -1;
                        }
                      }
                      else if (j.succ_high == 0) {
                        iVar12 = 0x10000 << (bVar9 & 0x1f);
                        iVar37 = j.img_comp[3].coeff_h;
                        do {
                          if (iVar37 < 0x10) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                          }
                          uVar49 = (ulong)j.huff_ac[lVar33].fast
                                          [(ulong)((uint)j.img_comp[3].coeff_w >> 0x17) - 8];
                          if (uVar49 == 0xff) {
                            lVar45 = 0;
                            do {
                              lVar46 = lVar45;
                              lVar45 = lVar46 + 1;
                            } while (j.huff_ac[lVar33].maxcode[lVar46 + 8] <=
                                     (uint)j.img_comp[3].coeff_w >> 0x10);
                            if (lVar45 == 8) goto LAB_00115605;
                            if (j.img_comp[3].coeff_h < (int)(lVar46 + 10)) goto LAB_0011560e;
                            uVar49 = (ulong)(int)(((uint)j.img_comp[3].coeff_w >>
                                                   (0x17U - (char)lVar45 & 0x1f) &
                                                  stbi__bmask[lVar46 + 10]) +
                                                 j.huff_ac[lVar33].delta[lVar46 + 8]);
                            bVar36 = j.huff_ac[lVar33].size[uVar49 - 8];
                            if (((uint)j.img_comp[3].coeff_w >> (-bVar36 & 0x1f) &
                                stbi__bmask[bVar36]) != (uint)j.huff_ac[lVar33].code[uVar49 - 4]) {
LAB_001168d5:
                              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                                            ,0x65b,
                                            "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                           );
                            }
                            iVar37 = (j.img_comp[3].coeff_h - (int)lVar45) + -9;
                            uVar54 = j.img_comp[3].coeff_w << ((byte)(lVar46 + 10) & 0x1f);
                            j.img_comp[3].coeff_h = iVar37;
                            j.img_comp[3].coeff_w = uVar54;
                          }
                          else {
                            bVar36 = j.huff_ac[lVar33].size[uVar49 - 8];
                            iVar37 = j.img_comp[3].coeff_h - (uint)bVar36;
                            if (j.img_comp[3].coeff_h < (int)(uint)bVar36) goto LAB_0011560e;
                            uVar54 = j.img_comp[3].coeff_w << (bVar36 & 0x1f);
                            j.img_comp[3].coeff_h = iVar37;
                            j.img_comp[3].coeff_w = uVar54;
                          }
                          bVar36 = j.huff_ac[lVar33].values[uVar49 - 8];
                          bVar4 = bVar36 >> 4;
                          uVar52 = (uint)bVar4;
                          uVar49 = (ulong)uVar52;
                          if ((bVar36 & 0xf) == 1) {
                            uVar52 = uVar54;
                            if (iVar37 < 1) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                              iVar37 = j.img_comp[3].coeff_h;
                              uVar52 = j.img_comp[3].coeff_w;
                            }
                            uVar54 = uVar52 * 2;
                            iVar37 = iVar37 + -1;
                            sVar30 = (short)(((int)~uVar52 >> 0x1f | 1U) << (bVar9 & 0x1f));
                            j.img_comp[3].coeff_h = iVar37;
                            j.img_comp[3].coeff_w = uVar54;
                          }
                          else {
                            if ((bVar36 & 0xf) != 0) goto LAB_0011560e;
                            if (bVar36 < 0xf0) {
                              j.succ_high = ~(-1 << bVar4);
                              uVar48 = 0x40;
                              if (0xf < bVar36) {
                                if (iVar37 < (int)uVar52) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                  iVar37 = j.img_comp[3].coeff_h;
                                  uVar54 = j.img_comp[3].coeff_w;
                                }
                                uVar42 = uVar54 << bVar4 | uVar54 >> 0x20 - bVar4;
                                uVar54 = ~stbi__bmask[uVar49] & uVar42;
                                iVar37 = iVar37 - uVar52;
                                j.img_comp[3].coeff_h = iVar37;
                                j.img_comp[3].coeff_w = uVar54;
                                j.succ_high = (uVar42 & stbi__bmask[uVar49]) + j.succ_high;
                                sVar30 = 0;
                                uVar49 = uVar48;
                                goto LAB_00113712;
                              }
                            }
                            else {
                              uVar48 = 0xf;
                            }
                            sVar30 = 0;
                            uVar49 = uVar48;
                          }
LAB_00113712:
                          uVar48 = (ulong)(uint)j.progressive;
                          iVar53 = j.progressive;
                          if ((int)pcVar50 <= j.progressive) {
                            psVar25 = (stbi__context *)(long)(int)pcVar50;
                            do {
                              bVar36 = psVar25[0x16ef].buffer_start[0x38];
                              if (data_01[bVar36] == 0) {
                                if ((int)uVar49 == 0) {
                                  pcVar50 = (code *)(ulong)((int)psVar25 + 1);
                                  data_01[bVar36] = sVar30;
                                  iVar53 = (int)uVar48;
                                  break;
                                }
                                uVar49 = (ulong)((int)uVar49 - 1);
                              }
                              else {
                                uVar52 = uVar54;
                                if (iVar37 < 1) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                  iVar37 = j.img_comp[3].coeff_h;
                                  uVar52 = j.img_comp[3].coeff_w;
                                }
                                uVar54 = uVar52 * 2;
                                iVar37 = iVar37 + -1;
                                j.img_comp[3].coeff_h = iVar37;
                                j.img_comp[3].coeff_w = uVar54;
                                if (((int)uVar52 < 0) &&
                                   (sVar1 = data_01[bVar36], (iVar12 >> 0x10 & (int)sVar1) == 0)) {
                                  sVar5 = (short)((uint)iVar12 >> 0x10);
                                  if (sVar1 < 1) {
                                    sVar5 = -sVar5;
                                  }
                                  data_01[bVar36] = sVar1 + sVar5;
                                }
                              }
                              pcVar50 = (code *)((long)&psVar25->img_x + 1);
                              uVar48 = (ulong)j.progressive;
                              bVar57 = (long)psVar25 < (long)uVar48;
                              psVar25 = (stbi__context *)pcVar50;
                              iVar53 = j.progressive;
                            } while (bVar57);
                          }
                        } while ((int)pcVar50 <= iVar53);
                      }
                      else {
                        j.succ_high = j.succ_high + -1;
                        if (j.nomore <= j.progressive) {
                          uVar54 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                          psVar25 = (stbi__context *)pcVar50;
                          do {
                            bVar9 = psVar25[0x16ef].buffer_start[0x38];
                            if (data_01[bVar9] != 0) {
                              if (j.img_comp[3].coeff_h < 1) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                              }
                              iVar37 = j.img_comp[3].coeff_w;
                              j.img_comp[3].coeff_h = j.img_comp[3].coeff_h + -1;
                              j.img_comp[3].coeff_w = j.img_comp[3].coeff_w * 2;
                              if ((iVar37 < 0) &&
                                 (sVar30 = data_01[bVar9], (uVar54 & (int)sVar30) == 0)) {
                                uVar52 = -uVar54;
                                if (0 < sVar30) {
                                  uVar52 = uVar54;
                                }
                                data_01[bVar9] = (short)uVar52 + sVar30;
                              }
                            }
                            pcVar50 = (code *)((long)&psVar25->img_x + 1);
                            bVar57 = (long)psVar25 < (long)j.progressive;
                            psVar25 = (stbi__context *)pcVar50;
                          } while (bVar57);
                        }
                      }
                    }
                    iVar37 = j.order[3];
                    j.order[3] = j.order[3] + -1;
                    if (iVar37 < 2) {
                      if (j.img_comp[3].coeff_h < 0x18) {
                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                      }
                      if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_001140bc;
                      j.img_comp[3].coeff_w = 0;
                      j.img_comp[3].coeff_h = 0;
                      j.code_bits = 0;
                      j.img_comp[2].hd = 0;
                      j.img_comp[1].hd = 0;
                      j.img_comp[0].hd = 0;
                      j.code_buffer._0_1_ = 0xff;
                      j.order[3] = j.order[2];
                      if (j.order[2] == 0) {
                        j.order[3] = 0x7fffffff;
                      }
                      j.succ_high = 0;
                    }
                    iVar15 = iVar15 + 1;
                  } while (iVar15 != iVar11);
                }
                local_44 = local_44 + 1;
              } while (local_44 != iVar39);
            }
          }
          else if (0 < j.img_v_max) {
            iVar10 = 0;
            iVar11 = j.img_v_max;
            iVar15 = j.img_h_max;
            do {
              if (0 < iVar15) {
                iVar37 = 0;
                do {
                  if (0 < j.succ_low) {
                    lVar43 = 0;
                    iVar11 = j.succ_low;
                    do {
                      iVar39 = j.order[lVar43 + -2];
                      iVar15 = j.img_comp[iVar39].id;
                      if (0 < iVar15) {
                        iVar12 = j.img_comp[(long)iVar39 + -1].coeff_h;
                        pcVar50 = (code *)0x0;
                        do {
                          if (0 < iVar12) {
                            iVar11 = 0;
                            do {
                              iVar15 = stbi__jpeg_decode_block_prog_dc
                                                 ((stbi__jpeg *)local_4a38,
                                                  (short *)(j.img_comp[iVar39].linebuf +
                                                           (long)((iVar12 * iVar37 + iVar11 +
                                                                  (j.img_comp[iVar39].id * iVar10 +
                                                                  (int)pcVar50) *
                                                                  *(int *)&j.img_comp[iVar39].coeff)
                                                                 * 0x40) * 2),
                                                  (stbi__huffman *)
                                                  (j.huff_dc[(long)j.img_comp[iVar39].v + -1].delta
                                                  + 0xf),iVar39);
                              if (iVar15 == 0) goto LAB_00114c11;
                              iVar11 = iVar11 + 1;
                              iVar12 = j.img_comp[(long)iVar39 + -1].coeff_h;
                            } while (iVar11 < iVar12);
                            iVar15 = j.img_comp[iVar39].id;
                          }
                          uVar54 = (int)pcVar50 + 1;
                          pcVar50 = (code *)(ulong)uVar54;
                          iVar11 = j.succ_low;
                        } while ((int)uVar54 < iVar15);
                      }
                      lVar43 = lVar43 + 1;
                      iVar39 = j.order[3];
                    } while (lVar43 < iVar11);
                  }
                  j.order[3] = iVar39 + -1;
                  if (iVar39 < 2) {
                    if (j.img_comp[3].coeff_h < 0x18) {
                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                    }
                    if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_001140bc;
                    j.img_comp[3].coeff_w = 0;
                    j.img_comp[3].coeff_h = 0;
                    j.code_bits = 0;
                    j.img_comp[2].hd = 0;
                    j.img_comp[1].hd = 0;
                    j.img_comp[0].hd = 0;
                    j.code_buffer._0_1_ = 0xff;
                    j.order[3] = j.order[2];
                    if (j.order[2] == 0) {
                      j.order[3] = 0x7fffffff;
                    }
                    j.succ_high = 0;
                  }
                  iVar37 = iVar37 + 1;
                  iVar11 = j.img_v_max;
                  iVar15 = j.img_h_max;
                  iVar39 = j.order[3];
                } while (iVar37 < j.img_h_max);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < iVar11);
          }
          goto LAB_001140bc;
        }
        stbi__g_failure_reason = "bad SOS len";
      }
      else {
        if (*(int *)((long)local_4a38 + 0x30) != 0) {
          psVar26 = (stbi_uc *)((long)local_4a38 + 0x38);
          iVar39 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                             (*(void **)((long)local_4a38 + 0x28),(char *)psVar26,
                              *(int *)((long)local_4a38 + 0x34));
          if (iVar39 == 0) {
            *(int *)((long)auVar56 + 0x30) = 0;
            psVar32 = (stbi_uc *)((long)auVar56 + 0x38) + 1;
            *(stbi_uc *)((long)auVar56 + 0x38) = '\0';
            bVar9 = 0;
          }
          else {
            psVar32 = psVar26 + iVar39;
            bVar9 = *psVar26;
          }
          *(stbi_uc **)((long)auVar56 + 0xc0) = psVar32;
          *(stbi_uc **)((long)auVar56 + 0xb8) = (stbi_uc *)((long)auVar56 + 0x38) + 1;
          goto LAB_00112f49;
        }
        j.succ_low = 0;
LAB_00114c03:
        stbi__g_failure_reason = "bad SOS component count";
      }
      goto LAB_00114c11;
    }
LAB_00114251:
    stbi__g_failure_reason = "bad req_comp";
    return (uchar *)0x0;
  }
  stbi__g_failure_reason = "no SOI";
  s->img_buffer = s->img_buffer_original;
  iVar10 = stbi__check_png_header(s);
  psVar26 = s->img_buffer_original;
  s->img_buffer = psVar26;
  if (iVar10 != 0) {
    if ((uint)req_comp < 5) {
      local_4a38 = (undefined1  [8])s;
      iVar10 = stbi__parse_png_file((stbi__png *)local_4a38,0,req_comp);
      auVar56 = local_4a38;
      puVar23 = (uchar *)CONCAT44(j.huff_dc[0].fast._12_4_,j.huff_dc[0].fast._8_4_);
      puVar47 = (uchar *)0x0;
      __ptr = puVar23;
      if (iVar10 != 0) {
        if ((req_comp != 0) && (*(int *)((long)local_4a38 + 0xc) != req_comp)) {
          puVar23 = stbi__convert_format
                              (puVar23,*(int *)((long)local_4a38 + 0xc),req_comp,
                               *(stbi__uint32 *)local_4a38,*(stbi__uint32 *)((long)local_4a38 + 4));
          *(int *)((long)auVar56 + 0xc) = req_comp;
          if (puVar23 == (uchar *)0x0) {
            return (uchar *)0x0;
          }
        }
        *x = *(stbi__uint32 *)auVar56;
        *y = *(stbi__uint32 *)((long)auVar56 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)((long)auVar56 + 0xc);
        }
        __ptr = (uchar *)0x0;
        puVar47 = puVar23;
      }
      free(__ptr);
      free((void *)CONCAT44(j.huff_dc[0].fast._4_4_,j.huff_dc[0].fast._0_4_));
      free(j.s);
      return puVar47;
    }
    goto LAB_00114251;
  }
  psVar32 = s->img_buffer_end;
  if (psVar26 < psVar32) {
    psVar27 = psVar26 + 1;
    s->img_buffer = psVar27;
    sVar8 = *psVar26;
LAB_00114374:
    if (sVar8 != 'B') goto LAB_0011447f;
    if (psVar27 < psVar32) {
      s->img_buffer = psVar27 + 1;
      sVar8 = *psVar27;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_0011447f;
      psVar26 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        psVar32 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar8 = '\0';
      }
      else {
        psVar32 = psVar26 + iVar10;
        sVar8 = *psVar26;
      }
      s->img_buffer_end = psVar32;
      s->img_buffer = s->buffer_start + 1;
    }
    if (sVar8 != 'M') goto LAB_0011447f;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar54 = stbi__get16le(s);
    iVar10 = stbi__get16le(s);
    uVar54 = iVar10 << 0x10 | uVar54;
    if (((uVar54 < 0x39) && ((0x100010000001000U >> ((ulong)uVar54 & 0x3f) & 1) != 0)) ||
       (uVar54 == 0x6c)) {
      psVar26 = s->img_buffer_original;
      s->img_buffer = psVar26;
LAB_0011445d:
      psVar32 = s->img_buffer_end;
      if (psVar26 < psVar32) {
        psVar27 = psVar26 + 1;
        s->img_buffer = psVar27;
        sVar8 = *psVar26;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00114cf8;
        psVar26 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          psVar32 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar8 = '\0';
        }
        else {
          psVar32 = psVar26 + iVar10;
          sVar8 = *psVar26;
        }
        s->img_buffer_end = psVar32;
        psVar27 = s->buffer_start + 1;
        s->img_buffer = psVar27;
      }
      if (sVar8 != 'B') {
LAB_00114cf8:
        stbi__g_failure_reason = "not BMP";
        return (uchar *)0x0;
      }
      if (psVar27 < psVar32) {
        s->img_buffer = psVar27 + 1;
        sVar8 = *psVar27;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00114cf8;
        psVar26 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          psVar32 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar8 = '\0';
        }
        else {
          psVar32 = psVar26 + iVar10;
          sVar8 = *psVar26;
        }
        s->img_buffer_end = psVar32;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar8 != 'M') goto LAB_00114cf8;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar54 = stbi__get16le(s);
      iVar10 = stbi__get16le(s);
      uVar52 = stbi__get16le(s);
      iVar39 = stbi__get16le(s);
      uVar52 = iVar39 << 0x10 | uVar52;
      if (((0x38 < uVar52) || ((0x100010000001000U >> ((ulong)uVar52 & 0x3f) & 1) == 0)) &&
         ((uVar52 != 0x6c && (uVar52 != 0x7c)))) {
        stbi__g_failure_reason = "unknown BMP";
        return (uchar *)0x0;
      }
      uVar42 = stbi__get16le(s);
      if (uVar52 == 0xc) {
        s->img_x = uVar42;
        uVar42 = stbi__get16le(s);
      }
      else {
        iVar39 = stbi__get16le(s);
        s->img_x = iVar39 << 0x10 | uVar42;
        uVar42 = stbi__get16le(s);
        iVar39 = stbi__get16le(s);
        uVar42 = iVar39 << 0x10 | uVar42;
      }
      s->img_y = uVar42;
      iVar39 = stbi__get16le(s);
      if (iVar39 != 1) goto LAB_00115d0b;
      uVar42 = stbi__get16le(s);
      if (uVar42 == 1) {
        stbi__g_failure_reason = "monochrome";
        return (uchar *)0x0;
      }
      uVar54 = iVar10 << 0x10 | uVar54;
      sVar2 = s->img_y;
      sVar31 = -sVar2;
      if (0 < (int)sVar2) {
        sVar31 = sVar2;
      }
      s->img_y = sVar31;
      if (uVar52 == 0xc) {
        sVar31 = 0;
        if (uVar42 < 0x18) {
          uVar49 = (ulong)(uint)((int)(uVar54 - 0x26) / 3);
        }
        else {
          uVar49 = 0;
        }
        local_44 = 0;
        uVar17 = 0;
        uVar16 = 0;
      }
      else {
        uVar13 = stbi__get16le(s);
        iVar10 = stbi__get16le(s);
        if ((iVar10 * 0x10000 + uVar13) - 1 < 2) {
          stbi__g_failure_reason = "BMP RLE";
          return (uchar *)0x0;
        }
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        if (uVar52 == 0x28) {
LAB_00115571:
          if (uVar42 != 0x20) {
            sVar31 = 0;
            local_44 = 0;
            uVar17 = 0;
            uVar16 = 0;
            if (uVar42 != 0x10) goto LAB_0011595e;
          }
          uVar13 = iVar10 * 0x10000 | uVar13;
          if (uVar13 == 3) {
            uVar16 = stbi__get32le(s);
            uVar17 = stbi__get32le(s);
            local_44 = stbi__get32le(s);
            if (uVar17 == local_44 && uVar16 == uVar17) goto LAB_00115d0b;
            sVar31 = 0;
          }
          else {
            if (uVar13 != 0) {
LAB_00115d0b:
              stbi__g_failure_reason = "bad BMP";
              return (uchar *)0x0;
            }
            bVar57 = uVar42 != 0x20;
            local_44 = 0x1f;
            if (!bVar57) {
              local_44 = 0xff;
            }
            uVar17 = 0x3e0;
            if (!bVar57) {
              uVar17 = 0xff00;
            }
            uVar16 = 0x7c00;
            if (!bVar57) {
              uVar16 = 0xff0000;
            }
            sVar31 = (uint)bVar57 * 0x1000000 - 0x1000000;
          }
        }
        else {
          if (uVar52 == 0x38) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            goto LAB_00115571;
          }
          if ((uVar52 | 0x10) != 0x7c) {
            __assert_fail("hsz == 108 || hsz == 124",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                          ,0x1229,
                          "stbi_uc *stbi__bmp_load(stbi__context *, int *, int *, int *, int)");
          }
          uVar16 = stbi__get32le(s);
          uVar17 = stbi__get32le(s);
          local_44 = stbi__get32le(s);
          sVar31 = stbi__get32le(s);
          stbi__get32le(s);
          iVar10 = 0xc;
          do {
            stbi__get16le(s);
            stbi__get16le(s);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
          if (uVar52 == 0x7c) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
          }
LAB_0011595e:
          if (uVar42 < 0x10) {
            uVar49 = (ulong)(uint)((int)((uVar54 - uVar52) + -0xe) >> 2);
            goto LAB_00115493;
          }
        }
        uVar49 = 0;
      }
LAB_00115493:
      iVar10 = 4 - (uint)(sVar31 == 0);
      s->img_n = iVar10;
      if (2 < req_comp) {
        iVar10 = req_comp;
      }
      puVar23 = (uchar *)malloc((ulong)(s->img_x * iVar10 * s->img_y));
      if (puVar23 == (uchar *)0x0) {
LAB_00114bed:
        stbi__g_failure_reason = "outofmem";
        return (uchar *)0x0;
      }
      if (uVar42 < 0x10) {
        iVar39 = (int)uVar49;
        if (0x100 < iVar39 || iVar39 == 0) {
          free(puVar23);
          stbi__g_failure_reason = "invalid";
          return (uchar *)0x0;
        }
        if (0 < iVar39) {
          psVar26 = s->buffer_start;
          psVar32 = s->buffer_start + 1;
          psVar27 = s->img_buffer;
          psVar28 = s->img_buffer_end;
          uVar48 = 0;
          do {
            if (psVar27 < psVar28) {
              s->img_buffer = psVar27 + 1;
              sVar8 = *psVar27;
              psVar27 = psVar27 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar8 = '\0';
            }
            else {
              iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar11 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
                psVar28 = psVar32;
              }
              else {
                sVar8 = *psVar26;
                psVar28 = psVar26 + iVar11;
              }
              s->img_buffer_end = psVar28;
              s->img_buffer = psVar32;
              psVar27 = psVar32;
            }
            j.huff_dc[0].fast[uVar48 * 4 + -0xe] = sVar8;
            if (psVar27 < psVar28) {
              s->img_buffer = psVar27 + 1;
              sVar8 = *psVar27;
              psVar27 = psVar27 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar8 = '\0';
            }
            else {
              iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar11 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
                psVar28 = psVar32;
              }
              else {
                sVar8 = *psVar26;
                psVar28 = psVar26 + iVar11;
              }
              s->img_buffer_end = psVar28;
              s->img_buffer = psVar32;
              psVar27 = psVar32;
            }
            j.huff_dc[0].fast[uVar48 * 4 + -0xf] = sVar8;
            if (psVar27 < psVar28) {
              s->img_buffer = psVar27 + 1;
              sVar8 = *psVar27;
              psVar27 = psVar27 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar8 = '\0';
            }
            else {
              iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar11 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
                psVar28 = psVar32;
              }
              else {
                sVar8 = *psVar26;
                psVar28 = psVar26 + iVar11;
              }
              s->img_buffer_end = psVar28;
              s->img_buffer = psVar32;
              psVar27 = psVar32;
            }
            j.huff_dc[0].fast[uVar48 * 4 + -0x10] = sVar8;
            if (uVar52 != 0xc) {
              if (psVar27 < psVar28) {
                psVar27 = psVar27 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_0011587a;
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  psVar28 = psVar32;
                }
                else {
                  psVar28 = psVar26 + iVar11;
                }
                s->img_buffer_end = psVar28;
                psVar27 = psVar32;
              }
              s->img_buffer = psVar27;
            }
LAB_0011587a:
            j.huff_dc[0].fast[uVar48 * 4 + -0xd] = 0xff;
            uVar48 = uVar48 + 1;
          } while (uVar49 != uVar48);
        }
        stbi__skip(s,(uVar54 - uVar52) + iVar39 * (uVar52 == 0xc | 0xfffffffc) + -0xe);
        if (uVar42 == 4) {
          uVar54 = s->img_x + 1 >> 1;
        }
        else {
          if (uVar42 != 8) {
            free(puVar23);
            stbi__g_failure_reason = "bad bpp";
            return (uchar *)0x0;
          }
          uVar54 = s->img_x;
        }
        y_00 = s->img_y;
        if (0 < (int)y_00) {
          psVar26 = s->buffer_start;
          psVar32 = s->buffer_start + 1;
          uVar49 = 0;
          iVar39 = 0;
          do {
            if (0 < (int)s->img_x) {
              psVar27 = s->img_buffer;
              psVar28 = s->img_buffer_end;
              iVar11 = 0;
              do {
                if (psVar27 < psVar28) {
                  s->img_buffer = psVar27 + 1;
                  bVar9 = *psVar27;
                  psVar27 = psVar27 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar9 = 0;
                }
                else {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar9 = 0;
                    psVar28 = psVar32;
                  }
                  else {
                    bVar9 = *psVar26;
                    psVar28 = psVar26 + iVar15;
                  }
                  s->img_buffer_end = psVar28;
                  s->img_buffer = psVar32;
                  psVar27 = psVar32;
                }
                uVar13 = bVar9 & 0xf;
                uVar52 = (uint)(bVar9 >> 4);
                if (uVar42 != 4) {
                  uVar52 = (uint)bVar9;
                }
                uVar48 = (ulong)uVar52;
                if (uVar42 != 4) {
                  uVar13 = 0;
                }
                lVar43 = (long)(int)uVar49;
                uVar41 = lVar43 + 3;
                puVar23[lVar43] = j.huff_dc[0].fast[uVar48 * 4 + -0x10];
                puVar23[lVar43 + 1] = j.huff_dc[0].fast[uVar48 * 4 + -0xf];
                puVar23[lVar43 + 2] = j.huff_dc[0].fast[uVar48 * 4 + -0xe];
                if (iVar10 == 4) {
                  puVar23[lVar43 + 3] = 0xff;
                  uVar41 = (ulong)((int)uVar49 + 4);
                }
                if (iVar11 + 1U == s->img_x) {
                  uVar49 = uVar41 & 0xffffffff;
                  break;
                }
                if (uVar42 == 8) {
                  if (psVar27 < psVar28) {
                    s->img_buffer = psVar27 + 1;
                    bVar9 = *psVar27;
                    psVar27 = psVar27 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar9 = 0;
                  }
                  else {
                    iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                    if (iVar15 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar28 = psVar32;
                    }
                    else {
                      bVar9 = *psVar26;
                      psVar28 = psVar26 + iVar15;
                    }
                    s->img_buffer_end = psVar28;
                    s->img_buffer = psVar32;
                    psVar27 = psVar32;
                  }
                  uVar13 = (uint)bVar9;
                }
                lVar43 = (long)(int)uVar41;
                uVar49 = lVar43 + 3;
                uVar48 = (ulong)uVar13;
                puVar23[lVar43] = j.huff_dc[0].fast[uVar48 * 4 + -0x10];
                puVar23[lVar43 + 1] = j.huff_dc[0].fast[uVar48 * 4 + -0xf];
                puVar23[lVar43 + 2] = j.huff_dc[0].fast[uVar48 * 4 + -0xe];
                if (iVar10 == 4) {
                  puVar23[lVar43 + 3] = 0xff;
                  uVar49 = (ulong)((int)uVar41 + 4);
                }
                iVar11 = iVar11 + 2;
              } while (iVar11 < (int)s->img_x);
            }
            stbi__skip(s,-uVar54 & 3);
            iVar39 = iVar39 + 1;
            y_00 = s->img_y;
          } while (iVar39 < (int)y_00);
        }
        goto LAB_001162c1;
      }
      stbi__skip(s,(uVar54 - uVar52) + -0xe);
      if (uVar42 == 0x20) {
        local_ac = 0;
        if (((sVar31 != 0xff000000) || (local_44 != 0xff)) ||
           ((uVar17 != 0xff00 || (uVar16 != 0xff0000)))) goto LAB_00115d8b;
        bVar6 = true;
        bVar57 = false;
        iVar39 = 0;
        local_7c = 0;
        local_9c = 0;
        local_b0 = 0;
        local_cc = 0;
        local_b8 = 0;
        local_b4 = 0;
        uVar54 = 0;
      }
      else if (uVar42 == 0x18) {
        local_ac = s->img_x & 3;
        bVar6 = false;
        bVar57 = false;
        iVar39 = 0;
        local_7c = 0;
        local_9c = 0;
        local_b0 = 0;
        local_cc = 0;
        local_b8 = 0;
        local_b4 = 0;
        uVar54 = 0;
      }
      else {
        local_ac = 0;
        if (uVar42 == 0x10) {
          local_ac = s->img_x * 2 & 2;
        }
LAB_00115d8b:
        if (((local_44 == 0) || (uVar17 == 0)) || (uVar16 == 0)) {
          free(puVar23);
          stbi__g_failure_reason = "bad masks";
          return (uchar *)0x0;
        }
        iVar39 = stbi__high_bit(uVar16);
        iVar39 = iVar39 + -7;
        local_cc = stbi__bitcount(uVar16);
        local_7c = stbi__high_bit(uVar17);
        local_7c = local_7c + -7;
        local_b8 = stbi__bitcount(uVar17);
        local_9c = stbi__high_bit(local_44);
        local_9c = local_9c + -7;
        local_b4 = stbi__bitcount(local_44);
        local_b0 = stbi__high_bit(sVar31);
        local_b0 = local_b0 + -7;
        uVar54 = stbi__bitcount(sVar31);
        bVar57 = true;
        bVar6 = false;
      }
      y_00 = s->img_y;
      if (0 < (int)y_00) {
        psVar26 = s->buffer_start;
        psVar32 = s->buffer_start + 1;
        uVar49 = 0;
        iVar11 = 0;
        do {
          uVar48 = uVar49;
          if (bVar57) {
            if (0 < (int)s->img_x) {
              iVar15 = 0;
              do {
                uVar52 = stbi__get16le(s);
                if (uVar42 != 0x10) {
                  iVar37 = stbi__get16le(s);
                  uVar52 = uVar52 | iVar37 << 0x10;
                }
                iVar37 = (int)(uVar52 & uVar16) >> ((byte)iVar39 & 0x1f);
                if (iVar39 < 0) {
                  iVar37 = (uVar52 & uVar16) << (-(byte)iVar39 & 0x1f);
                }
                uVar13 = local_cc;
                iVar12 = iVar37;
                if (local_cc < 8) {
                  do {
                    iVar12 = iVar12 + (iVar37 >> ((byte)uVar13 & 0x1f));
                    uVar35 = (uchar)iVar12;
                    uVar13 = uVar13 + local_cc;
                  } while (uVar13 < 8);
                }
                else {
                  uVar35 = (uchar)iVar37;
                }
                iVar37 = (int)(uVar52 & uVar17) >> ((byte)local_7c & 0x1f);
                if (local_7c < 0) {
                  iVar37 = (uVar52 & uVar17) << (-(byte)local_7c & 0x1f);
                }
                lVar43 = (long)(int)uVar49;
                puVar23[lVar43] = uVar35;
                uVar13 = local_b8;
                iVar12 = iVar37;
                if (local_b8 < 8) {
                  do {
                    iVar12 = iVar12 + (iVar37 >> ((byte)uVar13 & 0x1f));
                    uVar35 = (uchar)iVar12;
                    uVar13 = uVar13 + local_b8;
                  } while (uVar13 < 8);
                }
                else {
                  uVar35 = (uchar)iVar37;
                }
                iVar37 = (int)(uVar52 & local_44) >> ((byte)local_9c & 0x1f);
                if (local_9c < 0) {
                  iVar37 = (uVar52 & local_44) << (-(byte)local_9c & 0x1f);
                }
                puVar23[lVar43 + 1] = uVar35;
                uVar13 = local_b4;
                iVar12 = iVar37;
                if (local_b4 < 8) {
                  do {
                    iVar12 = iVar12 + (iVar37 >> ((byte)uVar13 & 0x1f));
                    uVar35 = (uchar)iVar12;
                    uVar13 = uVar13 + local_b4;
                  } while (uVar13 < 8);
                }
                else {
                  uVar35 = (uchar)iVar37;
                }
                puVar23[lVar43 + 2] = uVar35;
                if (sVar31 == 0) {
                  uVar35 = 0xff;
                }
                else {
                  iVar37 = (int)(uVar52 & sVar31) >> ((byte)local_b0 & 0x1f);
                  if (local_b0 < 0) {
                    iVar37 = (uVar52 & sVar31) << (-(byte)local_b0 & 0x1f);
                  }
                  uVar52 = uVar54;
                  iVar12 = iVar37;
                  if (uVar54 < 8) {
                    do {
                      iVar12 = iVar12 + (iVar37 >> ((byte)uVar52 & 0x1f));
                      uVar35 = (uchar)iVar12;
                      uVar52 = uVar52 + uVar54;
                    } while (uVar52 < 8);
                  }
                  else {
                    uVar35 = (uchar)iVar37;
                  }
                }
                uVar48 = lVar43 + 3;
                if (iVar10 == 4) {
                  puVar23[lVar43 + 3] = uVar35;
                  uVar48 = (ulong)((int)uVar49 + 4);
                }
                iVar15 = iVar15 + 1;
                uVar49 = uVar48 & 0xffffffff;
              } while (iVar15 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            psVar27 = s->img_buffer;
            psVar28 = s->img_buffer_end;
            iVar15 = 0;
            do {
              if (psVar27 < psVar28) {
                s->img_buffer = psVar27 + 1;
                uVar35 = *psVar27;
                psVar27 = psVar27 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar35 = '\0';
              }
              else {
                iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar37 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar35 = '\0';
                  psVar28 = psVar32;
                }
                else {
                  uVar35 = *psVar26;
                  psVar28 = psVar26 + iVar37;
                }
                s->img_buffer_end = psVar28;
                s->img_buffer = psVar32;
                psVar27 = psVar32;
              }
              lVar43 = (long)(int)uVar49;
              puVar23[lVar43 + 2] = uVar35;
              if (psVar27 < psVar28) {
                s->img_buffer = psVar27 + 1;
                uVar35 = *psVar27;
                psVar27 = psVar27 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar35 = '\0';
              }
              else {
                iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar37 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar35 = '\0';
                  psVar28 = psVar32;
                }
                else {
                  uVar35 = *psVar26;
                  psVar28 = psVar26 + iVar37;
                }
                s->img_buffer_end = psVar28;
                s->img_buffer = psVar32;
                psVar27 = psVar32;
              }
              puVar23[lVar43 + 1] = uVar35;
              if (psVar27 < psVar28) {
                s->img_buffer = psVar27 + 1;
                uVar35 = *psVar27;
                psVar27 = psVar27 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar35 = '\0';
              }
              else {
                iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar37 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar35 = '\0';
                  psVar28 = psVar32;
                }
                else {
                  uVar35 = *psVar26;
                  psVar28 = psVar26 + iVar37;
                }
                s->img_buffer_end = psVar28;
                s->img_buffer = psVar32;
                psVar27 = psVar32;
              }
              puVar23[lVar43] = uVar35;
              uVar35 = 0xff;
              if (bVar6) {
                if (psVar27 < psVar28) {
                  s->img_buffer = psVar27 + 1;
                  uVar35 = *psVar27;
                  psVar27 = psVar27 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  uVar35 = '\0';
                }
                else {
                  iVar37 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar37 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    uVar35 = '\0';
                    psVar28 = psVar32;
                  }
                  else {
                    uVar35 = *psVar26;
                    psVar28 = psVar26 + iVar37;
                  }
                  s->img_buffer_end = psVar28;
                  s->img_buffer = psVar32;
                  psVar27 = psVar32;
                }
              }
              uVar48 = lVar43 + 3;
              if (iVar10 == 4) {
                puVar23[lVar43 + 3] = uVar35;
                uVar48 = (ulong)((int)uVar49 + 4);
              }
              iVar15 = iVar15 + 1;
              uVar49 = uVar48 & 0xffffffff;
            } while (iVar15 < (int)s->img_x);
          }
          stbi__skip(s,local_ac);
          iVar11 = iVar11 + 1;
          y_00 = s->img_y;
          uVar49 = uVar48 & 0xffffffff;
        } while (iVar11 < (int)y_00);
      }
LAB_001162c1:
      if ((int)sVar2 < 1) {
        uVar54 = s->img_x;
      }
      else {
        uVar54 = s->img_x;
        if (0 < (int)y_00 >> 1) {
          uVar52 = uVar54 * iVar10;
          uVar42 = (y_00 - 1) * uVar52;
          uVar49 = 0;
          uVar48 = 0;
          do {
            if (0 < (int)uVar52) {
              uVar41 = 0;
              do {
                uVar35 = puVar23[uVar41 + uVar49];
                puVar23[uVar41 + uVar49] = puVar23[uVar41 + uVar42];
                puVar23[uVar41 + uVar42] = uVar35;
                uVar41 = uVar41 + 1;
              } while (uVar52 != uVar41);
            }
            uVar48 = uVar48 + 1;
            uVar42 = uVar42 - uVar52;
            uVar49 = (ulong)((int)uVar49 + uVar52);
          } while (uVar48 != (uint)((int)y_00 >> 1));
        }
      }
      if ((req_comp != 0) && (iVar10 != req_comp)) {
        puVar23 = stbi__convert_format(puVar23,iVar10,req_comp,uVar54,y_00);
        if (puVar23 == (uchar *)0x0) {
          return (uchar *)0x0;
        }
        uVar54 = s->img_x;
      }
      *x = uVar54;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar23;
      }
      return puVar23;
    }
    psVar26 = s->img_buffer_original;
    s->img_buffer = psVar26;
    if (uVar54 == 0x7c) goto LAB_0011445d;
    psVar32 = s->img_buffer_end;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar26 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        psVar32 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar8 = '\0';
      }
      else {
        psVar32 = psVar26 + iVar10;
        sVar8 = *psVar26;
      }
      s->img_buffer_end = psVar32;
      psVar27 = s->buffer_start + 1;
      s->img_buffer = psVar27;
      goto LAB_00114374;
    }
LAB_0011447f:
    psVar26 = s->img_buffer_original;
    s->img_buffer = psVar26;
  }
  if (psVar26 < psVar32) {
    psVar27 = psVar26 + 1;
    s->img_buffer = psVar27;
    sVar8 = *psVar26;
LAB_001144f1:
    if (sVar8 == 'G') {
      if (psVar27 < psVar32) {
        psVar26 = psVar27 + 1;
        s->img_buffer = psVar26;
        sVar8 = *psVar27;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00114eb7;
        psVar26 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          psVar32 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar8 = '\0';
        }
        else {
          psVar32 = psVar26 + iVar10;
          sVar8 = *psVar26;
        }
        s->img_buffer_end = psVar32;
        psVar26 = s->buffer_start + 1;
        s->img_buffer = psVar26;
      }
      if (sVar8 == 'I') {
        if (psVar26 < psVar32) {
          psVar27 = psVar26 + 1;
          s->img_buffer = psVar27;
          sVar8 = *psVar26;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_00114eb7;
          psVar26 = s->buffer_start;
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            psVar32 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar8 = '\0';
          }
          else {
            psVar32 = psVar26 + iVar10;
            sVar8 = *psVar26;
          }
          s->img_buffer_end = psVar32;
          psVar27 = s->buffer_start + 1;
          s->img_buffer = psVar27;
        }
        if (sVar8 == 'F') {
          if (psVar27 < psVar32) {
            psVar26 = psVar27 + 1;
            s->img_buffer = psVar26;
            sVar8 = *psVar27;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_00114eb7;
            psVar26 = s->buffer_start;
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              psVar32 = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
              sVar8 = '\0';
            }
            else {
              psVar32 = psVar26 + iVar10;
              sVar8 = *psVar26;
            }
            s->img_buffer_end = psVar32;
            psVar26 = s->buffer_start + 1;
            s->img_buffer = psVar26;
          }
          if (sVar8 == '8') {
            if (psVar26 < psVar32) {
              psVar27 = psVar26 + 1;
              s->img_buffer = psVar27;
              sVar8 = *psVar26;
            }
            else {
              if (s->read_from_callbacks == 0) goto LAB_00114eb7;
              psVar26 = s->buffer_start;
              iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar10 == 0) {
                s->read_from_callbacks = 0;
                psVar32 = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
              }
              else {
                psVar32 = psVar26 + iVar10;
                sVar8 = *psVar26;
              }
              s->img_buffer_end = psVar32;
              psVar27 = s->buffer_start + 1;
              s->img_buffer = psVar27;
            }
            if ((sVar8 == '9') || (sVar8 == '7')) {
              if (psVar27 < psVar32) {
                s->img_buffer = psVar27 + 1;
                sVar8 = *psVar27;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_00114eb7;
                psVar26 = s->buffer_start;
                iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar10 == 0) {
                  s->read_from_callbacks = 0;
                  psVar32 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  sVar8 = '\0';
                }
                else {
                  psVar32 = psVar26 + iVar10;
                  sVar8 = *psVar26;
                }
                s->img_buffer_end = psVar32;
              }
              s->img_buffer = s->img_buffer_original;
              if (sVar8 != 'a') goto LAB_00114ec5;
              memset((stbi__gif *)local_4a38,0,0x4858);
              iVar10 = stbi__gif_header(s,(stbi__gif *)local_4a38,comp,0);
              psVar25 = (stbi__context *)0x0;
              if (iVar10 == 0) goto LAB_00115681;
              iVar10 = local_4a38._0_4_;
              iVar39 = local_4a38._4_4_;
              iVar11 = local_4a38._0_4_ * local_4a38._4_4_;
              j.s = (stbi__context *)malloc((long)(iVar11 * 4));
              if (j.s == (stbi__context *)0x0) {
                stbi__g_failure_reason = "outofmem";
                goto LAB_0011567e;
              }
              if (0 < iVar11 * 4) {
                lVar43 = (long)(int)j.huff_dc[0].fast._4_4_;
                lVar33 = 0;
                do {
                  (j.s)->buffer_start[lVar33 + -0x38] = j.huff_dc[0].fast[lVar43 * 4 + 0x16];
                  (j.s)->buffer_start[lVar33 + -0x37] = j.huff_dc[0].fast[lVar43 * 4 + 0x15];
                  (j.s)->buffer_start[lVar33 + -0x36] = j.huff_dc[0].fast[lVar43 * 4 + 0x14];
                  (j.s)->buffer_start[lVar33 + -0x35] = j.huff_dc[0].fast[lVar43 * 4 + 0x17];
                  lVar33 = lVar33 + 4;
                  iVar10 = local_4a38._0_4_;
                  iVar39 = local_4a38._4_4_;
                } while (lVar33 < local_4a38._0_4_ * local_4a38._4_4_ * 4);
              }
              psVar26 = s->buffer_start;
              psVar32 = s->buffer_start + 1;
LAB_0011515e:
              pbVar20 = s->img_buffer;
              psVar27 = s->img_buffer_end;
              if (pbVar20 < psVar27) {
                s->img_buffer = pbVar20 + 1;
                bVar9 = *pbVar20;
                psVar28 = pbVar20 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_00115670;
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar9 = 0;
                  psVar27 = psVar32;
                }
                else {
                  bVar9 = *psVar26;
                  psVar27 = psVar26 + iVar11;
                }
                s->img_buffer_end = psVar27;
                s->img_buffer = psVar32;
                psVar28 = psVar32;
              }
              if (bVar9 == 0x21) {
                if (psVar28 < psVar27) {
                  s->img_buffer = psVar28 + 1;
                  bVar9 = *psVar28;
                  psVar28 = psVar28 + 1;
                }
                else {
                  if (s->read_from_callbacks == 0) goto LAB_001153b0;
                  iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar11 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar9 = 0;
                    psVar27 = psVar32;
                  }
                  else {
                    bVar9 = *psVar26;
                    psVar27 = psVar26 + iVar11;
                  }
                  s->img_buffer_end = psVar27;
                  s->img_buffer = psVar32;
                  psVar28 = psVar32;
                }
                if (bVar9 != 0xf9) goto LAB_001153b0;
                if (psVar28 < psVar27) {
                  s->img_buffer = psVar28 + 1;
                  bVar9 = *psVar28;
                  psVar28 = psVar28 + 1;
LAB_0011529b:
                  if (bVar9 == 4) {
                    if (psVar28 < psVar27) {
                      s->img_buffer = psVar28 + 1;
                      bVar9 = *psVar28;
                    }
                    else if (s->read_from_callbacks == 0) {
                      bVar9 = 0;
                    }
                    else {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar9 = 0;
                        psVar27 = psVar32;
                      }
                      else {
                        bVar9 = *psVar26;
                        psVar27 = psVar26 + iVar11;
                      }
                      s->img_buffer_end = psVar27;
                      s->img_buffer = psVar32;
                    }
                    j.huff_dc[0].fast._16_4_ = ZEXT14(bVar9);
                    stbi__get16le(s);
                    psVar28 = s->img_buffer;
                    psVar27 = s->img_buffer_end;
                    if (psVar28 < psVar27) {
                      s->img_buffer = psVar28 + 1;
                      bVar9 = *psVar28;
                      psVar28 = psVar28 + 1;
                    }
                    else if (s->read_from_callbacks == 0) {
                      bVar9 = 0;
                    }
                    else {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar9 = 0;
                        psVar27 = psVar32;
                      }
                      else {
                        bVar9 = *psVar26;
                        psVar27 = psVar26 + iVar11;
                      }
                      s->img_buffer_end = psVar27;
                      s->img_buffer = psVar32;
                      psVar28 = psVar32;
                    }
                    j.huff_dc[0].fast._12_4_ = ZEXT14(bVar9);
LAB_001153b0:
                    do {
                      if (psVar28 < psVar27) {
                        s->img_buffer = psVar28 + 1;
                        bVar9 = *psVar28;
                      }
                      else {
                        if (s->read_from_callbacks == 0) goto LAB_0011515e;
                        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                        if (iVar11 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar9 = 0;
                          psVar27 = psVar32;
                        }
                        else {
                          bVar9 = *psVar26;
                          psVar27 = psVar26 + iVar11;
                        }
                        s->img_buffer_end = psVar27;
                        s->img_buffer = psVar32;
                      }
                      if (bVar9 == 0) goto LAB_0011515e;
                      stbi__skip(s,(uint)bVar9);
                      psVar28 = s->img_buffer;
                      psVar27 = s->img_buffer_end;
                    } while( true );
                  }
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                    if (iVar11 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar27 = psVar32;
                    }
                    else {
                      bVar9 = *psVar26;
                      psVar27 = psVar26 + iVar11;
                    }
                    s->img_buffer_end = psVar27;
                    s->img_buffer = psVar32;
                    psVar28 = psVar32;
                    goto LAB_0011529b;
                  }
                  bVar9 = 0;
                }
                stbi__skip(s,(uint)bVar9);
                goto LAB_0011515e;
              }
              psVar25 = s;
              if (bVar9 == 0x3b) goto LAB_00115681;
              if (bVar9 == 0x2c) {
                iVar11 = stbi__get16le(s);
                iVar15 = stbi__get16le(s);
                iVar37 = stbi__get16le(s);
                iVar12 = stbi__get16le(s);
                if ((iVar10 < iVar37 + iVar11) || (iVar39 < iVar12 + iVar15)) {
                  stbi__g_failure_reason = "bad Image Descriptor";
                }
                else {
                  psVar27 = s->img_buffer;
                  psVar28 = s->img_buffer_end;
                  if (psVar27 < psVar28) {
                    s->img_buffer = psVar27 + 1;
                    bVar9 = *psVar27;
                    psVar27 = psVar27 + 1;
LAB_00116418:
                    if (-1 < (char)bVar9) goto LAB_0011644a;
                    stbi__gif_parse_colortable
                              (s,(stbi_uc (*) [4])(j.huff_dc[0].values + 0x14),2 << (bVar9 & 7),
                               -(uint)((j.huff_dc[0].fast._16_4_ & 1) == 0) |
                               j.huff_dc[0].fast._12_4_);
                    psVar27 = s->img_buffer;
                    psVar28 = s->img_buffer_end;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar9 = 0;
                        psVar28 = psVar32;
                      }
                      else {
                        bVar9 = *psVar26;
                        psVar28 = psVar26 + iVar10;
                      }
                      s->img_buffer_end = psVar28;
                      s->img_buffer = psVar32;
                      psVar27 = psVar32;
                      goto LAB_00116418;
                    }
LAB_0011644a:
                    if ((j.huff_dc[0].fast._0_4_ & 0x80) == 0) {
                      stbi__g_failure_reason = "missing color table";
                      goto LAB_0011567e;
                    }
                    lVar43 = 0;
                    do {
                      j.huff_dc[0].fast[lVar43 * 4 + 0x17] = 0xff;
                      lVar43 = lVar43 + 1;
                    } while (lVar43 != 0x100);
                    if ((-1 < (long)(int)j.huff_dc[0].fast._12_4_) &&
                       ((j.huff_dc[0].fast._16_4_ & 1) != 0)) {
                      j.huff_dc[0].fast[(long)(int)j.huff_dc[0].fast._12_4_ * 4 + 0x17] = '\0';
                    }
                  }
                  if (psVar27 < psVar28) {
                    s->img_buffer = psVar27 + 1;
                    bVar9 = *psVar27;
LAB_0011653c:
                    if (0xc < bVar9) goto LAB_0011567e;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar9 = 0;
                        psVar27 = psVar32;
                      }
                      else {
                        bVar9 = *psVar26;
                        psVar27 = psVar26 + iVar10;
                      }
                      s->img_buffer_end = psVar27;
                      s->img_buffer = psVar32;
                      goto LAB_0011653c;
                    }
                    bVar9 = 0;
                  }
                  uVar54 = 1 << (bVar9 & 0x1f);
                  uVar49 = 0;
                  do {
                    j.huff_dc[1].code[uVar49 * 2 + -0x3e] = 0xffff;
                    *(char *)(j.huff_dc[1].code + uVar49 * 2 + -0x3d) = (char)uVar49;
                    *(char *)((long)j.huff_dc[1].code + uVar49 * 4 + -0x79) = (char)uVar49;
                    uVar49 = uVar49 + 1;
                  } while (uVar54 != uVar49);
                  uVar16 = (2 << (bVar9 & 0x1f)) - 1;
                  local_50 = 0;
                  uVar52 = 0;
                  iVar10 = 0;
                  bVar57 = false;
                  uVar42 = uVar54 + 2;
                  uVar13 = 0xffffffff;
                  iVar39 = bVar9 + 1;
                  uVar17 = uVar16;
                  while( true ) {
                    do {
                      for (; uVar18 = uVar17, iVar11 = iVar39, uVar38 = uVar13, local_38 = uVar42,
                          bVar6 = bVar57, iVar39 = iVar10 - iVar11, iVar10 < iVar11;
                          iVar10 = iVar10 + 8) {
                        psVar27 = s->img_buffer;
                        psVar28 = s->img_buffer_end;
                        if (uVar52 == 0) {
                          if (psVar27 < psVar28) {
                            s->img_buffer = psVar27 + 1;
                            bVar36 = *psVar27;
                            psVar27 = psVar27 + 1;
                          }
                          else {
                            if (s->read_from_callbacks == 0) goto LAB_0011687b;
                            iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                            if (iVar39 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar36 = 0;
                              psVar28 = psVar32;
                            }
                            else {
                              bVar36 = *psVar26;
                              psVar28 = psVar26 + iVar39;
                            }
                            s->img_buffer_end = psVar28;
                            s->img_buffer = psVar32;
                            psVar27 = psVar32;
                          }
                          if (bVar36 == 0) goto LAB_0011687b;
                          uVar52 = (uint)bVar36;
                        }
                        if (psVar27 < psVar28) {
                          s->img_buffer = psVar27 + 1;
                          bVar36 = *psVar27;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar36 = 0;
                        }
                        else {
                          iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                          if (iVar39 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar36 = 0;
                            psVar27 = psVar32;
                          }
                          else {
                            bVar36 = *psVar26;
                            psVar27 = psVar26 + iVar39;
                          }
                          s->img_buffer_end = psVar27;
                          s->img_buffer = psVar32;
                        }
                        uVar52 = uVar52 - 1;
                        local_50 = local_50 | (uint)bVar36 << ((byte)iVar10 & 0x1f);
                        bVar57 = bVar6;
                        uVar42 = local_38;
                        uVar13 = uVar38;
                        iVar39 = iVar11;
                        uVar17 = uVar18;
                      }
                      uVar42 = (int)local_50 >> ((byte)iVar11 & 0x1f);
                      uVar55 = local_50 & uVar18;
                      local_50 = uVar42;
                      iVar10 = iVar39;
                      bVar57 = true;
                      uVar42 = uVar54 + 2;
                      uVar13 = 0xffffffff;
                      iVar39 = bVar9 + 1;
                      uVar17 = uVar16;
                    } while (uVar55 == uVar54);
                    if (uVar55 == uVar54 + 1) goto LAB_00116807;
                    if ((int)local_38 < (int)uVar55) break;
                    if (!bVar6) {
                      stbi__g_failure_reason = "no clear code";
                      goto LAB_0011567e;
                    }
                    if ((int)uVar38 < 0) {
                      if (uVar55 == local_38) break;
                    }
                    else {
                      if (0xfff < (int)local_38) {
                        stbi__g_failure_reason = "too many codes";
                        goto LAB_0011567e;
                      }
                      lVar43 = (long)(int)local_38;
                      local_38 = local_38 + 1;
                      j.huff_dc[1].code[lVar43 * 2 + -0x3e] = (stbi__uint16)uVar38;
                      uVar29 = (undefined1)j.huff_dc[1].code[(ulong)uVar38 * 2 + -0x3d];
                      *(undefined1 *)(j.huff_dc[1].code + lVar43 * 2 + -0x3d) = uVar29;
                      if (uVar55 != local_38) {
                        uVar29 = (undefined1)j.huff_dc[1].code[(long)(int)uVar55 * 2 + -0x3d];
                      }
                      *(undefined1 *)((long)j.huff_dc[1].code + lVar43 * 4 + -0x79) = uVar29;
                    }
                    stbi__out_gif_code((stbi__gif *)local_4a38,(stbi__uint16)uVar55);
                    bVar57 = true;
                    uVar42 = local_38;
                    uVar13 = uVar55;
                    iVar39 = iVar11 + 1;
                    uVar17 = ~(-1 << ((byte)(iVar11 + 1) & 0x1f));
                    if (0xfff < (int)local_38 || (local_38 & uVar18) != 0) {
                      iVar39 = iVar11;
                      uVar17 = uVar18;
                    }
                  }
                  stbi__g_failure_reason = "illegal code in raster";
                }
              }
              else {
LAB_00115670:
                stbi__g_failure_reason = "unknown code";
              }
LAB_0011567e:
              psVar25 = (stbi__context *)0x0;
LAB_00115681:
              psVar40 = (stbi__context *)0x0;
              if (psVar25 != s) {
                psVar40 = psVar25;
              }
              if (psVar40 != (stbi__context *)0x0) {
                *x = local_4a38._0_4_;
                *y = local_4a38._4_4_;
                return (uchar *)psVar40;
              }
              return (uchar *)0x0;
            }
          }
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar26 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar32 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar8 = '\0';
    }
    else {
      psVar32 = psVar26 + iVar10;
      sVar8 = *psVar26;
    }
    s->img_buffer_end = psVar32;
    psVar27 = s->buffer_start + 1;
    s->img_buffer = psVar27;
    goto LAB_001144f1;
  }
LAB_00114eb7:
  s->img_buffer = s->img_buffer_original;
LAB_00114ec5:
  iVar10 = stbi__psd_test(s);
  if (iVar10 != 0) {
    psVar26 = stbi__psd_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  iVar10 = stbi__pic_test(s);
  if (iVar10 != 0) {
    psVar26 = stbi__pic_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  iVar10 = stbi__pnm_test(s);
  if (iVar10 != 0) {
    psVar26 = stbi__pnm_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  iVar10 = stbi__hdr_test(s);
  if (iVar10 == 0) {
    iVar10 = stbi__tga_test(s);
    if (iVar10 == 0) {
      stbi__g_failure_reason = "unknown image type";
      return (uchar *)0x0;
    }
    psVar26 = stbi__tga_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  data_00 = stbi__hdr_load(s,x,y,comp,req_comp);
  if (req_comp == 0) {
    req_comp = *comp;
  }
  psVar26 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
  return psVar26;
LAB_001140ac:
  bVar57 = false;
LAB_001140ae:
  if (!bVar57) goto LAB_00114c11;
LAB_001140bc:
  auVar56 = (undefined1  [8])pcVar50;
  if ((byte)j.code_buffer == 0xff) {
LAB_001140c4:
    do {
      pcVar50 = (code *)auVar56;
      auVar56 = local_4a38;
      if (((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read ==
          (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001140e7:
        if (*(stbi_uc **)((long)auVar56 + 0xc0) <= *(stbi_uc **)((long)auVar56 + 0xb8))
        goto LAB_00112eae;
      }
      else {
        iVar10 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->eof)
                           (*(void **)((long)local_4a38 + 0x28));
        if (iVar10 != 0) {
          if (*(int *)((long)auVar56 + 0x30) != 0) goto LAB_001140e7;
          goto LAB_00112eae;
        }
      }
      auVar56 = local_4a38;
      psVar26 = *(stbi_uc **)((long)local_4a38 + 0xb8);
      if (psVar26 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
        *(stbi_uc **)((long)local_4a38 + 0xb8) = psVar26 + 1;
        sVar8 = *psVar26;
      }
      else {
        if (*(int *)((long)local_4a38 + 0x30) == 0) goto LAB_001140c4;
        psVar26 = (stbi_uc *)((long)local_4a38 + 0x38);
        iVar10 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                           (*(void **)((long)local_4a38 + 0x28),(char *)psVar26,
                            *(int *)((long)local_4a38 + 0x34));
        if (iVar10 == 0) {
          *(int *)((long)auVar56 + 0x30) = 0;
          psVar32 = (stbi_uc *)((long)auVar56 + 0x38) + 1;
          *(stbi_uc *)((long)auVar56 + 0x38) = '\0';
          sVar8 = '\0';
        }
        else {
          psVar32 = psVar26 + iVar10;
          sVar8 = *psVar26;
        }
        *(stbi_uc **)((long)auVar56 + 0xc0) = psVar32;
        *(stbi_uc **)((long)auVar56 + 0xb8) = (stbi_uc *)((long)auVar56 + 0x38) + 1;
      }
      pcVar50 = (code *)local_4a38;
    } while (sVar8 == '\0');
    if (sVar8 != 0xff) {
      stbi__g_failure_reason = "junk before marker";
      goto LAB_00114c11;
    }
    pbVar20 = *(stbi_uc **)((long)local_4a38 + 0xb8);
    if (pbVar20 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
      *(byte **)((long)local_4a38 + 0xb8) = pbVar20 + 1;
      j.code_buffer._0_1_ = *pbVar20;
    }
    else if (*(int *)((long)local_4a38 + 0x30) == 0) {
      j.code_buffer._0_1_ = 0;
    }
    else {
      psVar26 = (stbi_uc *)((long)local_4a38 + 0x38);
      iVar10 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                         (*(void **)((long)local_4a38 + 0x28),(char *)psVar26,
                          *(int *)((long)local_4a38 + 0x34));
      if (iVar10 == 0) {
        *(int *)((long)pcVar50 + 0x30) = 0;
        psVar32 = (stbi_uc *)((long)pcVar50 + 0x38) + 1;
        *(stbi_uc *)((long)pcVar50 + 0x38) = '\0';
        j.code_buffer._0_1_ = 0;
      }
      else {
        psVar32 = psVar26 + iVar10;
        j.code_buffer._0_1_ = *psVar26;
      }
      *(stbi_uc **)((long)pcVar50 + 0xc0) = psVar32;
      *(stbi_uc **)((long)pcVar50 + 0xb8) = (stbi_uc *)((long)pcVar50 + 0x38) + 1;
    }
  }
LAB_00112eae:
  bVar9 = stbi__get_marker((stbi__jpeg *)local_4a38);
  goto LAB_00112e87;
LAB_00115605:
  j.img_comp[3].coeff_h = j.img_comp[3].coeff_h + -0x10;
LAB_0011560e:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_00114c11;
LAB_00116807:
  stbi__skip(s,uVar52);
  pbVar20 = s->img_buffer;
  if (pbVar20 < s->img_buffer_end) {
    s->img_buffer = pbVar20 + 1;
    bVar9 = *pbVar20;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0011687b;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar9 = 0;
      psVar27 = psVar32;
    }
    else {
      bVar9 = *psVar26;
      psVar27 = psVar26 + iVar10;
    }
    s->img_buffer_end = psVar27;
    s->img_buffer = psVar32;
  }
  if (bVar9 == 0) goto LAB_0011687b;
  uVar52 = (uint)bVar9;
  goto LAB_00116807;
LAB_0011687b:
  if (j.s != (stbi__context *)0x0) {
    psVar25 = j.s;
    if ((req_comp & 0xfffffffbU) != 0) {
      psVar25 = (stbi__context *)
                stbi__convert_format((uchar *)j.s,4,req_comp,local_4a38._0_4_,local_4a38._4_4_);
    }
    goto LAB_00115681;
  }
  goto LAB_0011567e;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}